

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QList<bool_(*)(void_**)>_>::relocate
          (QArrayDataPointer<QList<bool_(*)(void_**)>_> *this,qsizetype offset,
          QList<bool_(*)(void_**)> **data)

{
  QList<bool_(*)(void_**)> *d_first;
  QList<bool_(*)(void_**)> *pQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QList<bool(*)(void**)>,long_long>(this->ptr,this->size,d_first);
  if (data != (QList<bool_(*)(void_**)> **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size)) {
      *data = pQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }